

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void totalFinalize(sqlite3_context *context)

{
  int iVar1;
  sqlite3_context *pCtx;
  double in_RDI;
  double r;
  SumCtx *p;
  Mem *rVal;
  
  rVal = (Mem *)0x0;
  pCtx = (sqlite3_context *)sqlite3_aggregate_context((sqlite3_context *)0x0,0);
  if (pCtx != (sqlite3_context *)0x0) {
    if ((char)pCtx->iOp == '\0') {
      rVal = (Mem *)(double)(long)pCtx->pMem;
    }
    else {
      rVal = pCtx->pOut;
      iVar1 = sqlite3IsOverflow(in_RDI);
      if (iVar1 == 0) {
        rVal = (Mem *)((double)pCtx->pFunc + (double)rVal);
      }
    }
  }
  sqlite3_result_double(pCtx,(double)rVal);
  return;
}

Assistant:

static void totalFinalize(sqlite3_context *context){
  SumCtx *p;
  double r = 0.0;
  p = sqlite3_aggregate_context(context, 0);
  if( p ){
    if( p->approx ){
      r = p->rSum;
      if( !sqlite3IsOverflow(p->rErr) ) r += p->rErr;
    }else{
      r = (double)(p->iSum);
    }
  }
  sqlite3_result_double(context, r);
}